

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void TestReadString<mp::internal::EndiannessConverter>
               (offset_in_BinaryReader<mp::internal::EndiannessConverter>_to_subr read,
               bool change_endianness)

{
  bool bVar1;
  code *pcVar2;
  int in_EDX;
  undefined7 in_register_00000031;
  char *pcVar3;
  long *plVar4;
  AssertionResult gtest_ar;
  string message;
  int data [3];
  AssertHelper local_110;
  size_t size;
  StringRef name;
  TestBinaryReader<mp::internal::EndiannessConverter> reader;
  NLStringRef local_60;
  NLStringRef local_50;
  NLStringRef local_40;
  
  data[2] = 0;
  data[0] = 3;
  data[1] = 0;
  if (in_EDX != 0) {
    ChangeEndianness<int>(data);
  }
  data[1] = 0x636261;
  mp::NLStringRef::NLStringRef(&local_40,(char *)data,7);
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            (&reader,local_40,(CStringRef)0x22c559);
  plVar4 = (long *)((long)&reader.super_BinaryReader<mp::internal::EndiannessConverter>.
                           super_BinaryReaderBase.super_ReaderBase.ptr_ +
                   CONCAT71(in_register_00000031,change_endianness));
  pcVar2 = (code *)read;
  if ((read & 1) != 0) {
    pcVar2 = *(code **)(*plVar4 + -1 + read);
  }
  name = (StringRef)(*pcVar2)(plVar4);
  fmt::BasicStringRef<char>::to_string_abi_cxx11_(&message,&name);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"abc\"","name.to_string()",(char (*) [4])0x2102b5,&message);
  std::__cxx11::string::~string((string *)&message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&size,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x1a4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&size,(Message *)&message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&size);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  TestBinaryReader<mp::internal::EndiannessConverter>::~TestBinaryReader(&reader);
  data[1]._2_1_ = 0;
  size = 6;
  mp::NLStringRef::NLStringRef(&local_50,(char *)data,6);
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            (&reader,local_50,(CStringRef)0x22c559);
  fmt::format<unsigned_long>(&message,(CStringRef)0x2103b2,&size);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string((string *)&name,(string *)&message);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      pcVar2 = (code *)read;
      if ((read & 1) != 0) {
        pcVar2 = *(code **)(*plVar4 + -1 + read);
      }
      (*pcVar2)(plVar4);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [105])
               "Expected: (reader.*read)() throws an exception of type mp::BinaryReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&name);
  }
  testing::Message::Message((Message *)&name);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_110,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x1ad,pcVar3);
  testing::internal::AssertHelper::operator=(&local_110,(Message *)&name);
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&name);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&message);
  TestBinaryReader<mp::internal::EndiannessConverter>::~TestBinaryReader(&reader);
  data[0] = -1;
  if ((char)in_EDX != '\0') {
    ChangeEndianness<int>(data);
  }
  mp::NLStringRef::NLStringRef(&local_60,(char *)data,7);
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            (&reader,local_60,(CStringRef)0x22c559);
  testing::AssertionSuccess();
  if ((char)name.data_ == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,"test:offset 0: expected unsigned integer",
               (allocator<char> *)&gtest_ar);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      if ((read & 1) != 0) {
        read = *(undefined8 *)(*plVar4 + -1 + read);
      }
      (*(code *)read)(plVar4);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&name,
               (char (*) [105])
               "Expected: (reader.*read)() throws an exception of type mp::BinaryReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&message);
  }
  testing::Message::Message((Message *)&message);
  if (name.size_ == 0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)name.size_;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x1b6,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&name.size_);
  TestBinaryReader<mp::internal::EndiannessConverter>::~TestBinaryReader(&reader);
  return;
}

Assistant:

void TestReadString(fmt::StringRef (BinaryReader<Converter>::*read)(),
                    bool change_endianness = false) {
  int data[] = {3, 0, 0};
  if (change_endianness)
    ChangeEndianness(data[0]);
  char *str = reinterpret_cast<char*>(data + 1);
  std::strcpy(str, "abc");
  {
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), sizeof(int) + 3));
    fmt::StringRef name = (reader.*read)();
    EXPECT_EQ("abc", name.to_string());
  }
  {
    str[2] = 0;
    std::size_t size = sizeof(int) + 2;
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), size));
    std::string message =
        fmt::format("test:offset {}: unexpected end of file", size);
    EXPECT_THROW_MSG((reader.*read)(), mp::BinaryReadError, message);
  }
  data[0] = -1;
  if (change_endianness)
    ChangeEndianness(data[0]);
  {
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), sizeof(int) + 3));
    EXPECT_THROW_MSG((reader.*read)(), mp::BinaryReadError,
                     "test:offset 0: expected unsigned integer");
  }
}